

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleTypeHandler<2UL>::SetIsPrototype(SimpleTypeHandler<2UL> *this,DynamicObject *instance)

{
  int *piVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *pSVar2;
  undefined8 extraout_RDX;
  
  if ((DAT_015bf346 == '\0') &&
     ((((this->super_DynamicTypeHandler).flags & 0x18) == 0 || (DAT_015bf345 != '\x01')))) {
    return;
  }
  pSVar2 = SimpleTypeHandler<2ul>::
           ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     ((SimpleTypeHandler<2ul> *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToSimpleDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pSVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52];
  (*UNRECOVERED_JUMPTABLE)(pSVar2,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void SimpleTypeHandler<size>::SetIsPrototype(DynamicObject* instance)
    {
        // Don't return if IsPrototypeFlag is set, because we may still need to do a type transition and
        // set fixed bits.  If this handler is shared, this instance may not even be a prototype yet.
        // In this case we may need to convert to a non-shared type handler.
        if (!ChangeTypeOnProto() && !(GetIsOrMayBecomeShared() && IsolatePrototypes()))
        {
            return;
        }

        ConvertToSimpleDictionaryType(instance)->SetIsPrototype(instance);
    }